

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comparison_expression.hpp
# Opt level: O1

string * __thiscall
duckdb::ComparisonExpression::ToString<duckdb::ComparisonExpression,duckdb::ParsedExpression>
          (string *__return_storage_ptr__,ComparisonExpression *this,ComparisonExpression *entry)

{
  pointer pPVar1;
  ExpressionType type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  string local_38;
  
  local_98[0] = local_88;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"(%s %s %s)","");
  pPVar1 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(&this->left);
  (*(pPVar1->super_BaseExpression)._vptr_BaseExpression[8])(&local_38,pPVar1);
  ExpressionTypeToOperator_abi_cxx11_
            (&local_58,(duckdb *)(ulong)(this->super_ParsedExpression).super_BaseExpression.type,
             type);
  pPVar1 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(&this->right);
  (*(pPVar1->super_BaseExpression)._vptr_BaseExpression[8])(&local_78,pPVar1);
  StringUtil::Format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (__return_storage_ptr__,(StringUtil *)local_98,&local_38,&local_58,&local_78,in_R9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  if (local_98[0] != local_88) {
    operator_delete(local_98[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

static string ToString(const T &entry) {
		return StringUtil::Format("(%s %s %s)", entry.left->ToString(),
		                          ExpressionTypeToOperator(entry.GetExpressionType()), entry.right->ToString());
	}